

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GazetteerValidator.cpp
# Opt level: O0

Result * CoreML::validate<(MLModelType)2004>(Result *__return_storage_ptr__,Model *format)

{
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  bool bVar1;
  uint32_t uVar2;
  ClassLabelsCase CVar3;
  CoreML *pCVar4;
  StringVector *this;
  ulong uVar5;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  allocator<char> local_1b1;
  string local_1b0;
  allocator<char> local_189;
  string local_188;
  int local_168;
  allocator<char> local_161;
  int numClassLabels;
  Gazetteer *local_140;
  Gazetteer *gazetteer;
  iterator local_130;
  size_type local_128;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_120;
  Result local_108;
  undefined4 local_dc;
  allocator<CoreML::Specification::FeatureType::TypeCase> local_d5;
  TypeCase local_d4;
  iterator local_d0;
  size_type local_c8;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_c0;
  Result local_a8;
  undefined1 local_80 [8];
  Result result;
  allocator<char> local_41;
  string local_40;
  ModelDescription *local_20;
  ModelDescription *interface;
  Model *format_local;
  
  interface = (ModelDescription *)format;
  format_local = (Model *)__return_storage_ptr__;
  local_20 = Specification::Model::description(format);
  bVar1 = Specification::Model::has_gazetteer((Model *)interface);
  if (bVar1) {
    Result::Result((Result *)local_80);
    pCVar4 = (CoreML *)Specification::ModelDescription::input(local_20);
    local_d4 = kStringType;
    local_d0 = &local_d4;
    local_c8 = 1;
    std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator(&local_d5);
    __l_00._M_len = local_c8;
    __l_00._M_array = local_d0;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector(&local_c0,__l_00,&local_d5);
    validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              (&local_a8,pCVar4,(RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,
               (int)&local_c0,in_R8);
    Result::operator=((Result *)local_80,&local_a8);
    Result::~Result(&local_a8);
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~vector(&local_c0);
    std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator(&local_d5);
    bVar1 = Result::good((Result *)local_80);
    if (bVar1) {
      pCVar4 = (CoreML *)Specification::ModelDescription::output(local_20);
      gazetteer._4_4_ = 3;
      local_130 = (iterator)((long)&gazetteer + 4);
      local_128 = 1;
      std::allocator<CoreML::Specification::FeatureType::TypeCase>::allocator
                ((allocator<CoreML::Specification::FeatureType::TypeCase> *)((long)&gazetteer + 3));
      __l._M_len = local_128;
      __l._M_array = local_130;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector(&local_120,__l,
               (allocator<CoreML::Specification::FeatureType::TypeCase> *)((long)&gazetteer + 3));
      validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                (&local_108,pCVar4,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_120,
                 in_R8);
      Result::operator=((Result *)local_80,&local_108);
      Result::~Result(&local_108);
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::~vector(&local_120);
      std::allocator<CoreML::Specification::FeatureType::TypeCase>::~allocator
                ((allocator<CoreML::Specification::FeatureType::TypeCase> *)((long)&gazetteer + 3));
      bVar1 = Result::good((Result *)local_80);
      if (bVar1) {
        local_140 = Specification::Model::gazetteer((Model *)interface);
        uVar2 = Specification::CoreMLModels::Gazetteer::revision(local_140);
        if (uVar2 < 2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&numClassLabels,
                     "Model revision number missing or invalid. Must be >= 2",&local_161);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&numClassLabels);
          std::__cxx11::string::~string((string *)&numClassLabels);
          std::allocator<char>::~allocator(&local_161);
        }
        else {
          CVar3 = Specification::CoreMLModels::Gazetteer::ClassLabels_case(local_140);
          if (CVar3 == CLASSLABELS_NOT_SET) {
            local_168 = -1;
          }
          else if (CVar3 == kStringClassLabels) {
            this = Specification::CoreMLModels::Gazetteer::stringclasslabels(local_140);
            local_168 = Specification::StringVector::vector_size(this);
          }
          if (local_168 < 1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_188,
                       "Model output class label not set. Must have at least one class label",
                       &local_189);
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_188);
            std::__cxx11::string::~string((string *)&local_188);
            std::allocator<char>::~allocator(&local_189);
          }
          else {
            Specification::CoreMLModels::Gazetteer::modelparameterdata_abi_cxx11_(local_140);
            uVar5 = std::__cxx11::string::empty();
            if ((uVar5 & 1) == 0) {
              Result::Result(__return_storage_ptr__,(Result *)local_80);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1b0,"Model parameter data not set",&local_1b1);
              Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1b0);
              std::__cxx11::string::~string((string *)&local_1b0);
              std::allocator<char>::~allocator(&local_1b1);
            }
          }
        }
      }
      else {
        Result::Result(__return_storage_ptr__,(Result *)local_80);
      }
    }
    else {
      Result::Result(__return_storage_ptr__,(Result *)local_80);
    }
    local_dc = 1;
    Result::~Result((Result *)local_80);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Model not a gazetteer.",&local_41);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_gazetteer>(const Specification::Model& format) {
        const auto& interface = format.description();
        
        // make sure model is a gazetteer
        if (!format.has_gazetteer()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model not a gazetteer.");
        }
        
        Result result;
        
        // Validate the inputs: only one input with string type is allowed
        result = validateDescriptionsContainFeatureWithTypes(interface.input(), 1, {Specification::FeatureType::kStringType});
        if (!result.good()) {
            return result;
        }
        
        // Validate the output: only one output feature with string type is allowed
        result = validateDescriptionsContainFeatureWithTypes(interface.output(), 1, {Specification::FeatureType::kStringType});
        if (!result.good()) {
            return result;
        }
        
        // Validate the model parameters
        const auto &gazetteer = format.gazetteer();
        if (gazetteer.revision() < 2) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model revision number missing or invalid. Must be >= 2");
        }
        
        int numClassLabels;
        switch (gazetteer.ClassLabels_case()) {
            case Specification::CoreMLModels::Gazetteer::kStringClassLabels:
                numClassLabels = gazetteer.stringclasslabels().vector_size();
                break;
            case Specification::CoreMLModels::Gazetteer::CLASSLABELS_NOT_SET:
                numClassLabels = -1;
                break;
        }
        
        if (numClassLabels <= 0) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model output class label not set. Must have at least one class label");
        }
        
        if (gazetteer.modelparameterdata().empty()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model parameter data not set");
        }
        
        return result;
    }